

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_at_one.cpp
# Opt level: O0

ulong parse_arg(int argc,char **argv)

{
  char *pcVar1;
  runtime_error *this;
  allocator local_51;
  string local_50 [48];
  unsigned_long local_20;
  ulong res;
  char **argv_local;
  int argc_local;
  
  res = (ulong)argv;
  argv_local._4_4_ = argc;
  if (argc < 2) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Incorrect input");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,pcVar1,&local_51);
  local_20 = std::__cxx11::stoul((string *)local_50,(size_t *)0x0,10);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return local_20;
}

Assistant:

ulong parse_arg(int argc, char *argv[]){
  ulong res;
  if(argc  < 2)
    throw std::runtime_error("Incorrect input");
  try{
    res = std::stoul(argv[1]);
  }catch(...){
    throw std::runtime_error("Parsing failed");
  }
  return res;
}